

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# word_wrapper.cpp
# Opt level: O1

bool __thiscall pstore::command_line::word_wrapper::operator==(word_wrapper *this,word_wrapper *rhs)

{
  size_t sVar1;
  int iVar2;
  
  sVar1 = this->text_->_M_string_length;
  if (((sVar1 == rhs->text_->_M_string_length) &&
      (((sVar1 == 0 ||
        (iVar2 = bcmp((this->text_->_M_dataplus)._M_p,(rhs->text_->_M_dataplus)._M_p,sVar1),
        iVar2 == 0)) && (this->max_width_ == rhs->max_width_)))) &&
     ((this->start_pos_ == rhs->start_pos_ &&
      (sVar1 = (this->substr_)._M_string_length, sVar1 == (rhs->substr_)._M_string_length)))) {
    if (sVar1 != 0) {
      iVar2 = bcmp((this->substr_)._M_dataplus._M_p,(rhs->substr_)._M_dataplus._M_p,sVar1);
      return iVar2 == 0;
    }
    return true;
  }
  return false;
}

Assistant:

bool word_wrapper::operator== (word_wrapper const & rhs) const {
                return text_ == rhs.text_ && max_width_ == rhs.max_width_ &&
                       start_pos_ == rhs.start_pos_ && substr_ == rhs.substr_;
            }